

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

int64_t PredictionCostBias(uint32_t *counts,uint64_t weight_0,uint64_t exp_val)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint32_t *puVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = *counts * weight_0 * 0x800000;
  lVar2 = exp_val << 0x17;
  puVar4 = counts + 1;
  for (lVar6 = 0; lVar6 != -0xf; lVar6 = lVar6 + -1) {
    lVar3 = (ulong)(counts[lVar6 + 0xff] + *puVar4) * lVar2;
    lVar1 = lVar3 + 0x32;
    if (lVar3 < 0) {
      lVar1 = lVar3 + -0x32;
    }
    lVar5 = lVar5 + lVar1 / 100;
    lVar2 = lVar2 * 6;
    lVar1 = lVar2 + 5;
    if (lVar2 < 0) {
      lVar1 = lVar2 + -5;
    }
    lVar2 = lVar1 / 10;
    puVar4 = puVar4 + 1;
  }
  lVar2 = lVar5 + 5;
  if (lVar5 < 0) {
    lVar2 = lVar5 + -5;
  }
  return lVar2 / -10;
}

Assistant:

static int64_t PredictionCostBias(const uint32_t counts[256], uint64_t weight_0,
                                  uint64_t exp_val) {
  const int significant_symbols = 256 >> 4;
  const uint64_t exp_decay_factor = 6;  // has a scaling factor of 1/10
  uint64_t bits = (weight_0 * counts[0]) << LOG_2_PRECISION_BITS;
  int i;
  exp_val <<= LOG_2_PRECISION_BITS;
  for (i = 1; i < significant_symbols; ++i) {
    bits += DivRound(exp_val * (counts[i] + counts[256 - i]), 100);
    exp_val = DivRound(exp_decay_factor * exp_val, 10);
  }
  return -DivRound((int64_t)bits, 10);
}